

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall EOPlus::Context::~Context(Context *this)

{
  code *pcVar1;
  Context *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Context::~Context()
	{

	}